

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall
ft::vector<int,ft::allocator<int>>::insert<int*>
          (vector<int,ft::allocator<int>> *this,iterator position,int *first,int *last,type *param_4
          )

{
  value_type_conflict *__dest;
  long lVar1;
  iterator piVar2;
  value_type_conflict *val;
  iterator piVar3;
  size_t __n;
  
  piVar3 = (iterator)(*(long *)(this + 8) * 4 + *(long *)this);
  __dest = (value_type_conflict *)operator_new((long)piVar3 - (long)position);
  __n = (long)piVar3 - (long)position;
  if (__n != 0) {
    memcpy(__dest,position,__n);
  }
  lVar1 = *(long *)(this + 8);
  piVar2 = (iterator)(lVar1 * 4 + *(long *)this);
  if (piVar2 != position) {
    do {
      lVar1 = lVar1 + -1;
      piVar2 = piVar2 + -1;
    } while (piVar2 != position);
    *(long *)(this + 8) = lVar1;
  }
  for (; first != last; first = first + 1) {
    vector<int,_ft::allocator<int>_>::push_back((vector<int,_ft::allocator<int>_> *)this,first);
  }
  val = __dest;
  if (piVar3 != position) {
    do {
      vector<int,_ft::allocator<int>_>::push_back((vector<int,_ft::allocator<int>_> *)this,val);
      __n = __n - 4;
      val = val + 1;
    } while (__n != 0);
  }
  operator_delete(__dest);
  return;
}

Assistant:

void        insert(iterator position, Iterator first, Iterator last,
					   typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		vector	tmp(position, this->end());
		while (position != this->end())
			this->pop_back();
		while (first != last) {
			this->push_back(*first);
			++first;
		}
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
	}